

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O2

void highbd_dr_prediction_32bit_z1_64xN_avx2
               (int N,uint16_t *dst,ptrdiff_t stride,uint16_t *above,int upsample_above,int dx)

{
  long lVar1;
  long lVar2;
  uint16_t uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar14 [32];
  
  lVar1 = (long)N + 0x3f;
  uVar3 = above[(long)N + 0x3f];
  auVar13._2_2_ = uVar3;
  auVar13._0_2_ = uVar3;
  auVar13._4_2_ = uVar3;
  auVar13._6_2_ = uVar3;
  auVar13._8_2_ = uVar3;
  auVar13._10_2_ = uVar3;
  auVar13._12_2_ = uVar3;
  auVar13._14_2_ = uVar3;
  auVar14._16_2_ = uVar3;
  auVar14._0_16_ = auVar13;
  auVar14._18_2_ = uVar3;
  auVar14._20_2_ = uVar3;
  auVar14._22_2_ = uVar3;
  auVar14._24_2_ = uVar3;
  auVar14._26_2_ = uVar3;
  auVar14._28_2_ = uVar3;
  auVar14._30_2_ = uVar3;
  auVar16._0_2_ = (undefined2)(N + 0x3f);
  auVar16._2_2_ = auVar16._0_2_;
  auVar16._4_2_ = auVar16._0_2_;
  auVar16._6_2_ = auVar16._0_2_;
  auVar16._8_2_ = auVar16._0_2_;
  auVar16._10_2_ = auVar16._0_2_;
  auVar16._12_2_ = auVar16._0_2_;
  auVar16._14_2_ = auVar16._0_2_;
  auVar16._16_2_ = auVar16._0_2_;
  auVar16._18_2_ = auVar16._0_2_;
  auVar16._20_2_ = auVar16._0_2_;
  auVar16._22_2_ = auVar16._0_2_;
  auVar16._24_2_ = auVar16._0_2_;
  auVar16._26_2_ = auVar16._0_2_;
  auVar16._28_2_ = auVar16._0_2_;
  auVar16._30_2_ = auVar16._0_2_;
  iVar9 = 0;
  iVar10 = 0;
  if (0 < N) {
    iVar10 = N;
  }
  auVar17._8_4_ = 0x10;
  auVar17._0_8_ = 0x1000000010;
  auVar17._12_4_ = 0x10;
  auVar17._16_4_ = 0x10;
  auVar17._20_4_ = 0x10;
  auVar17._24_4_ = 0x10;
  auVar17._28_4_ = 0x10;
  auVar4 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
  uVar8 = upsample_above;
  while( true ) {
    if (iVar9 == iVar10) {
      return;
    }
    uVar11 = (int)uVar8 >> 6;
    iVar5 = N;
    if ((int)uVar11 < (int)lVar1) {
      uVar6 = uVar8 >> 1;
      uVar7 = uVar6 & 0x1f;
      auVar18._0_8_ = CONCAT44(uVar6,uVar6) & 0x1f0000001f;
      auVar18._8_4_ = uVar7;
      auVar18._12_4_ = uVar7;
      auVar18._16_4_ = uVar7;
      auVar18._20_4_ = uVar7;
      auVar18._24_4_ = uVar7;
      auVar18._28_4_ = uVar7;
      lVar12 = (long)(int)uVar11;
      auVar15 = auVar14._16_16_;
      auVar21 = auVar14;
      if (lVar12 < lVar1) {
        auVar26 = auVar13;
        if (8 < (ulong)(lVar1 - lVar12)) {
          auVar21 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar12 + 8));
          auVar28 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar12 + 9));
          auVar28 = vpsubd_avx2(auVar28,auVar21);
          auVar21 = vpslld_avx2(auVar21,5);
          auVar28 = vpmulld_avx2(auVar28,auVar18);
          auVar21 = vpaddd_avx2(auVar21,auVar17);
          auVar21 = vpaddd_avx2(auVar28,auVar21);
          auVar21 = vpsrld_avx2(auVar21,5);
          auVar28._0_16_ = ZEXT116(0) * auVar13 + ZEXT116(1) * auVar21._16_16_;
          auVar28._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar13;
          auVar21 = vpackusdw_avx2(auVar21,auVar28);
          auVar26 = auVar21._0_16_;
        }
        auVar21 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar12));
        auVar28 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar12 + 1));
        auVar28 = vpsubd_avx2(auVar28,auVar21);
        auVar21 = vpslld_avx2(auVar21,5);
        auVar28 = vpmulld_avx2(auVar28,auVar18);
        auVar21 = vpaddd_avx2(auVar21,auVar17);
        auVar21 = vpaddd_avx2(auVar28,auVar21);
        auVar21 = vpsrld_avx2(auVar21,5);
        auVar21 = vpackusdw_avx2(auVar21,ZEXT1632(auVar21._16_16_));
        auVar22._0_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar21._0_16_;
        auVar22._16_16_ = ZEXT116(0) * auVar21._16_16_ + ZEXT116(1) * auVar26;
        auVar26._0_2_ = (undefined2)uVar11;
        auVar26._2_2_ = auVar26._0_2_;
        auVar26._4_2_ = auVar26._0_2_;
        auVar26._6_2_ = auVar26._0_2_;
        auVar26._8_2_ = auVar26._0_2_;
        auVar26._10_2_ = auVar26._0_2_;
        auVar26._12_2_ = auVar26._0_2_;
        auVar26._14_2_ = auVar26._0_2_;
        auVar26 = vpaddw_avx(auVar26,auVar4);
        auVar34 = vpslldq_avx(auVar26,2);
        auVar34 = vpblendw_avx(auVar34,ZEXT416(uVar11),1);
        auVar26 = vpsrldq_avx(auVar26,0xe);
        auVar21._0_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar13;
        auVar21._16_16_ = ZEXT116(0) * auVar15 + ZEXT116(1) * auVar26;
        auVar42._0_2_ = (undefined2)(uVar11 + 9);
        auVar42._2_2_ = auVar42._0_2_;
        auVar42._4_2_ = auVar42._0_2_;
        auVar42._6_2_ = auVar42._0_2_;
        auVar42._8_2_ = auVar42._0_2_;
        auVar42._10_2_ = auVar42._0_2_;
        auVar42._12_2_ = auVar42._0_2_;
        auVar42._14_2_ = auVar42._0_2_;
        auVar42._16_2_ = auVar42._0_2_;
        auVar42._18_2_ = auVar42._0_2_;
        auVar42._20_2_ = auVar42._0_2_;
        auVar42._22_2_ = auVar42._0_2_;
        auVar42._24_2_ = auVar42._0_2_;
        auVar42._26_2_ = auVar42._0_2_;
        auVar42._28_2_ = auVar42._0_2_;
        auVar42._30_2_ = auVar42._0_2_;
        auVar21 = vpblendw_avx2(auVar21,auVar42,2);
        auVar43._0_2_ = (undefined2)(uVar11 + 10);
        auVar43._2_2_ = auVar43._0_2_;
        auVar43._4_2_ = auVar43._0_2_;
        auVar43._6_2_ = auVar43._0_2_;
        auVar43._8_2_ = auVar43._0_2_;
        auVar43._10_2_ = auVar43._0_2_;
        auVar43._12_2_ = auVar43._0_2_;
        auVar43._14_2_ = auVar43._0_2_;
        auVar43._16_2_ = auVar43._0_2_;
        auVar43._18_2_ = auVar43._0_2_;
        auVar43._20_2_ = auVar43._0_2_;
        auVar43._22_2_ = auVar43._0_2_;
        auVar43._24_2_ = auVar43._0_2_;
        auVar43._26_2_ = auVar43._0_2_;
        auVar43._28_2_ = auVar43._0_2_;
        auVar43._30_2_ = auVar43._0_2_;
        auVar21 = vpblendw_avx2(auVar21,auVar43,4);
        auVar44._0_2_ = (undefined2)(uVar11 + 0xb);
        auVar44._2_2_ = auVar44._0_2_;
        auVar44._4_2_ = auVar44._0_2_;
        auVar44._6_2_ = auVar44._0_2_;
        auVar44._8_2_ = auVar44._0_2_;
        auVar44._10_2_ = auVar44._0_2_;
        auVar44._12_2_ = auVar44._0_2_;
        auVar44._14_2_ = auVar44._0_2_;
        auVar44._16_2_ = auVar44._0_2_;
        auVar44._18_2_ = auVar44._0_2_;
        auVar44._20_2_ = auVar44._0_2_;
        auVar44._22_2_ = auVar44._0_2_;
        auVar44._24_2_ = auVar44._0_2_;
        auVar44._26_2_ = auVar44._0_2_;
        auVar44._28_2_ = auVar44._0_2_;
        auVar44._30_2_ = auVar44._0_2_;
        auVar21 = vpblendw_avx2(auVar21,auVar44,8);
        auVar45._0_2_ = (undefined2)(uVar11 + 0xc);
        auVar45._2_2_ = auVar45._0_2_;
        auVar45._4_2_ = auVar45._0_2_;
        auVar45._6_2_ = auVar45._0_2_;
        auVar45._8_2_ = auVar45._0_2_;
        auVar45._10_2_ = auVar45._0_2_;
        auVar45._12_2_ = auVar45._0_2_;
        auVar45._14_2_ = auVar45._0_2_;
        auVar45._16_2_ = auVar45._0_2_;
        auVar45._18_2_ = auVar45._0_2_;
        auVar45._20_2_ = auVar45._0_2_;
        auVar45._22_2_ = auVar45._0_2_;
        auVar45._24_2_ = auVar45._0_2_;
        auVar45._26_2_ = auVar45._0_2_;
        auVar45._28_2_ = auVar45._0_2_;
        auVar45._30_2_ = auVar45._0_2_;
        auVar21 = vpblendw_avx2(auVar21,auVar45,0x10);
        auVar46._0_2_ = (undefined2)(uVar11 + 0xd);
        auVar46._2_2_ = auVar46._0_2_;
        auVar46._4_2_ = auVar46._0_2_;
        auVar46._6_2_ = auVar46._0_2_;
        auVar46._8_2_ = auVar46._0_2_;
        auVar46._10_2_ = auVar46._0_2_;
        auVar46._12_2_ = auVar46._0_2_;
        auVar46._14_2_ = auVar46._0_2_;
        auVar46._16_2_ = auVar46._0_2_;
        auVar46._18_2_ = auVar46._0_2_;
        auVar46._20_2_ = auVar46._0_2_;
        auVar46._22_2_ = auVar46._0_2_;
        auVar46._24_2_ = auVar46._0_2_;
        auVar46._26_2_ = auVar46._0_2_;
        auVar46._28_2_ = auVar46._0_2_;
        auVar46._30_2_ = auVar46._0_2_;
        auVar21 = vpblendw_avx2(auVar21,auVar46,0x20);
        auVar47._0_2_ = (undefined2)(uVar11 + 0xe);
        auVar47._2_2_ = auVar47._0_2_;
        auVar47._4_2_ = auVar47._0_2_;
        auVar47._6_2_ = auVar47._0_2_;
        auVar47._8_2_ = auVar47._0_2_;
        auVar47._10_2_ = auVar47._0_2_;
        auVar47._12_2_ = auVar47._0_2_;
        auVar47._14_2_ = auVar47._0_2_;
        auVar47._16_2_ = auVar47._0_2_;
        auVar47._18_2_ = auVar47._0_2_;
        auVar47._20_2_ = auVar47._0_2_;
        auVar47._22_2_ = auVar47._0_2_;
        auVar47._24_2_ = auVar47._0_2_;
        auVar47._26_2_ = auVar47._0_2_;
        auVar47._28_2_ = auVar47._0_2_;
        auVar47._30_2_ = auVar47._0_2_;
        auVar21 = vpblendw_avx2(auVar21,auVar47,0x40);
        auVar48._0_2_ = (undefined2)(uVar11 + 0xf);
        auVar48._2_2_ = auVar48._0_2_;
        auVar48._4_2_ = auVar48._0_2_;
        auVar48._6_2_ = auVar48._0_2_;
        auVar48._8_2_ = auVar48._0_2_;
        auVar48._10_2_ = auVar48._0_2_;
        auVar48._12_2_ = auVar48._0_2_;
        auVar48._14_2_ = auVar48._0_2_;
        auVar48._16_2_ = auVar48._0_2_;
        auVar48._18_2_ = auVar48._0_2_;
        auVar48._20_2_ = auVar48._0_2_;
        auVar48._22_2_ = auVar48._0_2_;
        auVar48._24_2_ = auVar48._0_2_;
        auVar48._26_2_ = auVar48._0_2_;
        auVar48._28_2_ = auVar48._0_2_;
        auVar48._30_2_ = auVar48._0_2_;
        auVar21 = vpblendw_avx2(auVar21,auVar48,0x80);
        auVar21 = vpblendd_avx2(ZEXT1632(auVar34),auVar21,0xf0);
        auVar21 = vpcmpgtw_avx2(auVar16,auVar21);
        auVar21 = vpblendvb_avx2(auVar14,auVar22,auVar21);
      }
      *(undefined1 (*) [32])dst = auVar21;
      lVar2 = lVar12 + 0x10;
      auVar21 = auVar14;
      if (lVar2 < lVar1) {
        auVar26 = auVar13;
        if (8 < (ulong)(lVar1 - lVar2)) {
          auVar21 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar12 + 0x18));
          auVar28 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar12 + 0x19));
          auVar28 = vpsubd_avx2(auVar28,auVar21);
          auVar21 = vpslld_avx2(auVar21,5);
          auVar28 = vpmulld_avx2(auVar28,auVar18);
          auVar21 = vpaddd_avx2(auVar21,auVar17);
          auVar21 = vpaddd_avx2(auVar28,auVar21);
          auVar21 = vpsrld_avx2(auVar21,5);
          auVar29._0_16_ = ZEXT116(0) * auVar13 + ZEXT116(1) * auVar21._16_16_;
          auVar29._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar13;
          auVar21 = vpackusdw_avx2(auVar21,auVar29);
          auVar26 = auVar21._0_16_;
        }
        auVar21 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar12 + 0x10));
        auVar28 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar12 + 0x11));
        auVar28 = vpsubd_avx2(auVar28,auVar21);
        auVar21 = vpslld_avx2(auVar21,5);
        auVar28 = vpmulld_avx2(auVar28,auVar18);
        auVar21 = vpaddd_avx2(auVar21,auVar17);
        auVar21 = vpaddd_avx2(auVar28,auVar21);
        auVar21 = vpsrld_avx2(auVar21,5);
        auVar21 = vpackusdw_avx2(auVar21,ZEXT1632(auVar21._16_16_));
        auVar23._0_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar21._0_16_;
        auVar23._16_16_ = ZEXT116(0) * auVar21._16_16_ + ZEXT116(1) * auVar26;
        uVar6 = (uint)lVar2;
        auVar34._0_2_ = (undefined2)lVar2;
        auVar34._2_2_ = auVar34._0_2_;
        auVar34._4_2_ = auVar34._0_2_;
        auVar34._6_2_ = auVar34._0_2_;
        auVar34._8_2_ = auVar34._0_2_;
        auVar34._10_2_ = auVar34._0_2_;
        auVar34._12_2_ = auVar34._0_2_;
        auVar34._14_2_ = auVar34._0_2_;
        auVar26 = vpaddw_avx(auVar34,auVar4);
        auVar34 = vpslldq_avx(auVar26,2);
        auVar34 = vpblendw_avx(auVar34,ZEXT416(uVar6),1);
        auVar26 = vpsrldq_avx(auVar26,0xe);
        auVar30._0_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar13;
        auVar30._16_16_ = ZEXT116(0) * auVar15 + ZEXT116(1) * auVar26;
        auVar49._0_2_ = (undefined2)(uVar6 + 9);
        auVar49._2_2_ = auVar49._0_2_;
        auVar49._4_2_ = auVar49._0_2_;
        auVar49._6_2_ = auVar49._0_2_;
        auVar49._8_2_ = auVar49._0_2_;
        auVar49._10_2_ = auVar49._0_2_;
        auVar49._12_2_ = auVar49._0_2_;
        auVar49._14_2_ = auVar49._0_2_;
        auVar49._16_2_ = auVar49._0_2_;
        auVar49._18_2_ = auVar49._0_2_;
        auVar49._20_2_ = auVar49._0_2_;
        auVar49._22_2_ = auVar49._0_2_;
        auVar49._24_2_ = auVar49._0_2_;
        auVar49._26_2_ = auVar49._0_2_;
        auVar49._28_2_ = auVar49._0_2_;
        auVar49._30_2_ = auVar49._0_2_;
        auVar21 = vpblendw_avx2(auVar30,auVar49,2);
        auVar50._0_2_ = (undefined2)(uVar6 + 10);
        auVar50._2_2_ = auVar50._0_2_;
        auVar50._4_2_ = auVar50._0_2_;
        auVar50._6_2_ = auVar50._0_2_;
        auVar50._8_2_ = auVar50._0_2_;
        auVar50._10_2_ = auVar50._0_2_;
        auVar50._12_2_ = auVar50._0_2_;
        auVar50._14_2_ = auVar50._0_2_;
        auVar50._16_2_ = auVar50._0_2_;
        auVar50._18_2_ = auVar50._0_2_;
        auVar50._20_2_ = auVar50._0_2_;
        auVar50._22_2_ = auVar50._0_2_;
        auVar50._24_2_ = auVar50._0_2_;
        auVar50._26_2_ = auVar50._0_2_;
        auVar50._28_2_ = auVar50._0_2_;
        auVar50._30_2_ = auVar50._0_2_;
        auVar21 = vpblendw_avx2(auVar21,auVar50,4);
        auVar51._0_2_ = (undefined2)(uVar6 + 0xb);
        auVar51._2_2_ = auVar51._0_2_;
        auVar51._4_2_ = auVar51._0_2_;
        auVar51._6_2_ = auVar51._0_2_;
        auVar51._8_2_ = auVar51._0_2_;
        auVar51._10_2_ = auVar51._0_2_;
        auVar51._12_2_ = auVar51._0_2_;
        auVar51._14_2_ = auVar51._0_2_;
        auVar51._16_2_ = auVar51._0_2_;
        auVar51._18_2_ = auVar51._0_2_;
        auVar51._20_2_ = auVar51._0_2_;
        auVar51._22_2_ = auVar51._0_2_;
        auVar51._24_2_ = auVar51._0_2_;
        auVar51._26_2_ = auVar51._0_2_;
        auVar51._28_2_ = auVar51._0_2_;
        auVar51._30_2_ = auVar51._0_2_;
        auVar21 = vpblendw_avx2(auVar21,auVar51,8);
        auVar52._0_2_ = (undefined2)(uVar6 + 0xc);
        auVar52._2_2_ = auVar52._0_2_;
        auVar52._4_2_ = auVar52._0_2_;
        auVar52._6_2_ = auVar52._0_2_;
        auVar52._8_2_ = auVar52._0_2_;
        auVar52._10_2_ = auVar52._0_2_;
        auVar52._12_2_ = auVar52._0_2_;
        auVar52._14_2_ = auVar52._0_2_;
        auVar52._16_2_ = auVar52._0_2_;
        auVar52._18_2_ = auVar52._0_2_;
        auVar52._20_2_ = auVar52._0_2_;
        auVar52._22_2_ = auVar52._0_2_;
        auVar52._24_2_ = auVar52._0_2_;
        auVar52._26_2_ = auVar52._0_2_;
        auVar52._28_2_ = auVar52._0_2_;
        auVar52._30_2_ = auVar52._0_2_;
        auVar21 = vpblendw_avx2(auVar21,auVar52,0x10);
        auVar53._0_2_ = (undefined2)(uVar6 + 0xd);
        auVar53._2_2_ = auVar53._0_2_;
        auVar53._4_2_ = auVar53._0_2_;
        auVar53._6_2_ = auVar53._0_2_;
        auVar53._8_2_ = auVar53._0_2_;
        auVar53._10_2_ = auVar53._0_2_;
        auVar53._12_2_ = auVar53._0_2_;
        auVar53._14_2_ = auVar53._0_2_;
        auVar53._16_2_ = auVar53._0_2_;
        auVar53._18_2_ = auVar53._0_2_;
        auVar53._20_2_ = auVar53._0_2_;
        auVar53._22_2_ = auVar53._0_2_;
        auVar53._24_2_ = auVar53._0_2_;
        auVar53._26_2_ = auVar53._0_2_;
        auVar53._28_2_ = auVar53._0_2_;
        auVar53._30_2_ = auVar53._0_2_;
        auVar21 = vpblendw_avx2(auVar21,auVar53,0x20);
        auVar54._0_2_ = (undefined2)(uVar6 + 0xe);
        auVar54._2_2_ = auVar54._0_2_;
        auVar54._4_2_ = auVar54._0_2_;
        auVar54._6_2_ = auVar54._0_2_;
        auVar54._8_2_ = auVar54._0_2_;
        auVar54._10_2_ = auVar54._0_2_;
        auVar54._12_2_ = auVar54._0_2_;
        auVar54._14_2_ = auVar54._0_2_;
        auVar54._16_2_ = auVar54._0_2_;
        auVar54._18_2_ = auVar54._0_2_;
        auVar54._20_2_ = auVar54._0_2_;
        auVar54._22_2_ = auVar54._0_2_;
        auVar54._24_2_ = auVar54._0_2_;
        auVar54._26_2_ = auVar54._0_2_;
        auVar54._28_2_ = auVar54._0_2_;
        auVar54._30_2_ = auVar54._0_2_;
        auVar21 = vpblendw_avx2(auVar21,auVar54,0x40);
        auVar55._0_2_ = (undefined2)(uVar6 + 0xf);
        auVar55._2_2_ = auVar55._0_2_;
        auVar55._4_2_ = auVar55._0_2_;
        auVar55._6_2_ = auVar55._0_2_;
        auVar55._8_2_ = auVar55._0_2_;
        auVar55._10_2_ = auVar55._0_2_;
        auVar55._12_2_ = auVar55._0_2_;
        auVar55._14_2_ = auVar55._0_2_;
        auVar55._16_2_ = auVar55._0_2_;
        auVar55._18_2_ = auVar55._0_2_;
        auVar55._20_2_ = auVar55._0_2_;
        auVar55._22_2_ = auVar55._0_2_;
        auVar55._24_2_ = auVar55._0_2_;
        auVar55._26_2_ = auVar55._0_2_;
        auVar55._28_2_ = auVar55._0_2_;
        auVar55._30_2_ = auVar55._0_2_;
        auVar21 = vpblendw_avx2(auVar21,auVar55,0x80);
        auVar21 = vpblendd_avx2(ZEXT1632(auVar34),auVar21,0xf0);
        auVar21 = vpcmpgtw_avx2(auVar16,auVar21);
        auVar21 = vpblendvb_avx2(auVar14,auVar23,auVar21);
      }
      *(undefined1 (*) [32])((long)dst + 0x20) = auVar21;
      lVar2 = lVar12 + 0x20;
      auVar21 = auVar14;
      if (lVar2 < lVar1) {
        auVar26 = auVar13;
        if (8 < (ulong)(lVar1 - lVar2)) {
          auVar21 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar12 + 0x28));
          auVar28 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar12 + 0x29));
          auVar28 = vpsubd_avx2(auVar28,auVar21);
          auVar21 = vpslld_avx2(auVar21,5);
          auVar28 = vpmulld_avx2(auVar28,auVar18);
          auVar21 = vpaddd_avx2(auVar21,auVar17);
          auVar21 = vpaddd_avx2(auVar28,auVar21);
          auVar21 = vpsrld_avx2(auVar21,5);
          auVar31._0_16_ = ZEXT116(0) * auVar13 + ZEXT116(1) * auVar21._16_16_;
          auVar31._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar13;
          auVar21 = vpackusdw_avx2(auVar21,auVar31);
          auVar26 = auVar21._0_16_;
        }
        auVar21 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar12 + 0x20));
        auVar28 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar12 + 0x21));
        auVar28 = vpsubd_avx2(auVar28,auVar21);
        auVar21 = vpslld_avx2(auVar21,5);
        auVar28 = vpmulld_avx2(auVar28,auVar18);
        auVar21 = vpaddd_avx2(auVar21,auVar17);
        auVar21 = vpaddd_avx2(auVar28,auVar21);
        auVar21 = vpsrld_avx2(auVar21,5);
        auVar21 = vpackusdw_avx2(auVar21,ZEXT1632(auVar21._16_16_));
        auVar24._0_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar21._0_16_;
        auVar24._16_16_ = ZEXT116(0) * auVar21._16_16_ + ZEXT116(1) * auVar26;
        uVar6 = (uint)lVar2;
        auVar27._0_2_ = (undefined2)lVar2;
        auVar27._2_2_ = auVar27._0_2_;
        auVar27._4_2_ = auVar27._0_2_;
        auVar27._6_2_ = auVar27._0_2_;
        auVar27._8_2_ = auVar27._0_2_;
        auVar27._10_2_ = auVar27._0_2_;
        auVar27._12_2_ = auVar27._0_2_;
        auVar27._14_2_ = auVar27._0_2_;
        auVar26 = vpaddw_avx(auVar27,auVar4);
        auVar34 = vpslldq_avx(auVar26,2);
        auVar34 = vpblendw_avx(auVar34,ZEXT416(uVar6),1);
        auVar26 = vpsrldq_avx(auVar26,0xe);
        auVar32._0_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar13;
        auVar32._16_16_ = ZEXT116(0) * auVar15 + ZEXT116(1) * auVar26;
        auVar56._0_2_ = (undefined2)(uVar6 + 9);
        auVar56._2_2_ = auVar56._0_2_;
        auVar56._4_2_ = auVar56._0_2_;
        auVar56._6_2_ = auVar56._0_2_;
        auVar56._8_2_ = auVar56._0_2_;
        auVar56._10_2_ = auVar56._0_2_;
        auVar56._12_2_ = auVar56._0_2_;
        auVar56._14_2_ = auVar56._0_2_;
        auVar56._16_2_ = auVar56._0_2_;
        auVar56._18_2_ = auVar56._0_2_;
        auVar56._20_2_ = auVar56._0_2_;
        auVar56._22_2_ = auVar56._0_2_;
        auVar56._24_2_ = auVar56._0_2_;
        auVar56._26_2_ = auVar56._0_2_;
        auVar56._28_2_ = auVar56._0_2_;
        auVar56._30_2_ = auVar56._0_2_;
        auVar21 = vpblendw_avx2(auVar32,auVar56,2);
        auVar57._0_2_ = (undefined2)(uVar6 + 10);
        auVar57._2_2_ = auVar57._0_2_;
        auVar57._4_2_ = auVar57._0_2_;
        auVar57._6_2_ = auVar57._0_2_;
        auVar57._8_2_ = auVar57._0_2_;
        auVar57._10_2_ = auVar57._0_2_;
        auVar57._12_2_ = auVar57._0_2_;
        auVar57._14_2_ = auVar57._0_2_;
        auVar57._16_2_ = auVar57._0_2_;
        auVar57._18_2_ = auVar57._0_2_;
        auVar57._20_2_ = auVar57._0_2_;
        auVar57._22_2_ = auVar57._0_2_;
        auVar57._24_2_ = auVar57._0_2_;
        auVar57._26_2_ = auVar57._0_2_;
        auVar57._28_2_ = auVar57._0_2_;
        auVar57._30_2_ = auVar57._0_2_;
        auVar21 = vpblendw_avx2(auVar21,auVar57,4);
        auVar58._0_2_ = (undefined2)(uVar6 + 0xb);
        auVar58._2_2_ = auVar58._0_2_;
        auVar58._4_2_ = auVar58._0_2_;
        auVar58._6_2_ = auVar58._0_2_;
        auVar58._8_2_ = auVar58._0_2_;
        auVar58._10_2_ = auVar58._0_2_;
        auVar58._12_2_ = auVar58._0_2_;
        auVar58._14_2_ = auVar58._0_2_;
        auVar58._16_2_ = auVar58._0_2_;
        auVar58._18_2_ = auVar58._0_2_;
        auVar58._20_2_ = auVar58._0_2_;
        auVar58._22_2_ = auVar58._0_2_;
        auVar58._24_2_ = auVar58._0_2_;
        auVar58._26_2_ = auVar58._0_2_;
        auVar58._28_2_ = auVar58._0_2_;
        auVar58._30_2_ = auVar58._0_2_;
        auVar21 = vpblendw_avx2(auVar21,auVar58,8);
        auVar59._0_2_ = (undefined2)(uVar6 + 0xc);
        auVar59._2_2_ = auVar59._0_2_;
        auVar59._4_2_ = auVar59._0_2_;
        auVar59._6_2_ = auVar59._0_2_;
        auVar59._8_2_ = auVar59._0_2_;
        auVar59._10_2_ = auVar59._0_2_;
        auVar59._12_2_ = auVar59._0_2_;
        auVar59._14_2_ = auVar59._0_2_;
        auVar59._16_2_ = auVar59._0_2_;
        auVar59._18_2_ = auVar59._0_2_;
        auVar59._20_2_ = auVar59._0_2_;
        auVar59._22_2_ = auVar59._0_2_;
        auVar59._24_2_ = auVar59._0_2_;
        auVar59._26_2_ = auVar59._0_2_;
        auVar59._28_2_ = auVar59._0_2_;
        auVar59._30_2_ = auVar59._0_2_;
        auVar21 = vpblendw_avx2(auVar21,auVar59,0x10);
        auVar60._0_2_ = (undefined2)(uVar6 + 0xd);
        auVar60._2_2_ = auVar60._0_2_;
        auVar60._4_2_ = auVar60._0_2_;
        auVar60._6_2_ = auVar60._0_2_;
        auVar60._8_2_ = auVar60._0_2_;
        auVar60._10_2_ = auVar60._0_2_;
        auVar60._12_2_ = auVar60._0_2_;
        auVar60._14_2_ = auVar60._0_2_;
        auVar60._16_2_ = auVar60._0_2_;
        auVar60._18_2_ = auVar60._0_2_;
        auVar60._20_2_ = auVar60._0_2_;
        auVar60._22_2_ = auVar60._0_2_;
        auVar60._24_2_ = auVar60._0_2_;
        auVar60._26_2_ = auVar60._0_2_;
        auVar60._28_2_ = auVar60._0_2_;
        auVar60._30_2_ = auVar60._0_2_;
        auVar21 = vpblendw_avx2(auVar21,auVar60,0x20);
        auVar61._0_2_ = (undefined2)(uVar6 + 0xe);
        auVar61._2_2_ = auVar61._0_2_;
        auVar61._4_2_ = auVar61._0_2_;
        auVar61._6_2_ = auVar61._0_2_;
        auVar61._8_2_ = auVar61._0_2_;
        auVar61._10_2_ = auVar61._0_2_;
        auVar61._12_2_ = auVar61._0_2_;
        auVar61._14_2_ = auVar61._0_2_;
        auVar61._16_2_ = auVar61._0_2_;
        auVar61._18_2_ = auVar61._0_2_;
        auVar61._20_2_ = auVar61._0_2_;
        auVar61._22_2_ = auVar61._0_2_;
        auVar61._24_2_ = auVar61._0_2_;
        auVar61._26_2_ = auVar61._0_2_;
        auVar61._28_2_ = auVar61._0_2_;
        auVar61._30_2_ = auVar61._0_2_;
        auVar21 = vpblendw_avx2(auVar21,auVar61,0x40);
        auVar62._0_2_ = (undefined2)(uVar6 + 0xf);
        auVar62._2_2_ = auVar62._0_2_;
        auVar62._4_2_ = auVar62._0_2_;
        auVar62._6_2_ = auVar62._0_2_;
        auVar62._8_2_ = auVar62._0_2_;
        auVar62._10_2_ = auVar62._0_2_;
        auVar62._12_2_ = auVar62._0_2_;
        auVar62._14_2_ = auVar62._0_2_;
        auVar62._16_2_ = auVar62._0_2_;
        auVar62._18_2_ = auVar62._0_2_;
        auVar62._20_2_ = auVar62._0_2_;
        auVar62._22_2_ = auVar62._0_2_;
        auVar62._24_2_ = auVar62._0_2_;
        auVar62._26_2_ = auVar62._0_2_;
        auVar62._28_2_ = auVar62._0_2_;
        auVar62._30_2_ = auVar62._0_2_;
        auVar21 = vpblendw_avx2(auVar21,auVar62,0x80);
        auVar21 = vpblendd_avx2(ZEXT1632(auVar34),auVar21,0xf0);
        auVar21 = vpcmpgtw_avx2(auVar16,auVar21);
        auVar21 = vpblendvb_avx2(auVar14,auVar24,auVar21);
      }
      *(undefined1 (*) [32])((long)dst + 0x40) = auVar21;
      lVar2 = lVar12 + 0x30;
      auVar21 = auVar14;
      if (lVar2 < lVar1) {
        auVar26 = auVar13;
        if (8 < (ulong)(lVar1 - lVar2)) {
          auVar21 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar12 + 0x38));
          auVar28 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar12 + 0x39));
          auVar28 = vpsubd_avx2(auVar28,auVar21);
          auVar21 = vpslld_avx2(auVar21,5);
          auVar28 = vpmulld_avx2(auVar28,auVar18);
          auVar21 = vpaddd_avx2(auVar21,auVar17);
          auVar21 = vpaddd_avx2(auVar28,auVar21);
          auVar21 = vpsrld_avx2(auVar21,5);
          auVar33._0_16_ = ZEXT116(0) * auVar13 + ZEXT116(1) * auVar21._16_16_;
          auVar33._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar13;
          auVar21 = vpackusdw_avx2(auVar21,auVar33);
          auVar26 = auVar21._0_16_;
        }
        auVar21 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar12 + 0x30));
        auVar28 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + lVar12 + 0x31));
        auVar28 = vpsubd_avx2(auVar28,auVar21);
        auVar21 = vpslld_avx2(auVar21,5);
        auVar18 = vpmulld_avx2(auVar28,auVar18);
        auVar21 = vpaddd_avx2(auVar21,auVar17);
        auVar21 = vpaddd_avx2(auVar18,auVar21);
        auVar21 = vpsrld_avx2(auVar21,5);
        auVar21 = vpackusdw_avx2(auVar21,ZEXT1632(auVar21._16_16_));
        auVar19._0_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar21._0_16_;
        auVar19._16_16_ = ZEXT116(0) * auVar21._16_16_ + ZEXT116(1) * auVar26;
        uVar6 = (uint)lVar2;
        auVar20._0_2_ = (undefined2)lVar2;
        auVar20._2_2_ = auVar20._0_2_;
        auVar20._4_2_ = auVar20._0_2_;
        auVar20._6_2_ = auVar20._0_2_;
        auVar20._8_2_ = auVar20._0_2_;
        auVar20._10_2_ = auVar20._0_2_;
        auVar20._12_2_ = auVar20._0_2_;
        auVar20._14_2_ = auVar20._0_2_;
        auVar26 = vpaddw_avx(auVar20,auVar4);
        auVar34 = vpslldq_avx(auVar26,2);
        auVar34 = vpblendw_avx(auVar34,ZEXT416(uVar6),1);
        auVar26 = vpsrldq_avx(auVar26,0xe);
        auVar25._0_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar13;
        auVar25._16_16_ = ZEXT116(0) * auVar15 + ZEXT116(1) * auVar26;
        auVar35._0_2_ = (undefined2)(uVar6 + 9);
        auVar35._2_2_ = auVar35._0_2_;
        auVar35._4_2_ = auVar35._0_2_;
        auVar35._6_2_ = auVar35._0_2_;
        auVar35._8_2_ = auVar35._0_2_;
        auVar35._10_2_ = auVar35._0_2_;
        auVar35._12_2_ = auVar35._0_2_;
        auVar35._14_2_ = auVar35._0_2_;
        auVar35._16_2_ = auVar35._0_2_;
        auVar35._18_2_ = auVar35._0_2_;
        auVar35._20_2_ = auVar35._0_2_;
        auVar35._22_2_ = auVar35._0_2_;
        auVar35._24_2_ = auVar35._0_2_;
        auVar35._26_2_ = auVar35._0_2_;
        auVar35._28_2_ = auVar35._0_2_;
        auVar35._30_2_ = auVar35._0_2_;
        auVar21 = vpblendw_avx2(auVar25,auVar35,2);
        auVar36._0_2_ = (undefined2)(uVar6 + 10);
        auVar36._2_2_ = auVar36._0_2_;
        auVar36._4_2_ = auVar36._0_2_;
        auVar36._6_2_ = auVar36._0_2_;
        auVar36._8_2_ = auVar36._0_2_;
        auVar36._10_2_ = auVar36._0_2_;
        auVar36._12_2_ = auVar36._0_2_;
        auVar36._14_2_ = auVar36._0_2_;
        auVar36._16_2_ = auVar36._0_2_;
        auVar36._18_2_ = auVar36._0_2_;
        auVar36._20_2_ = auVar36._0_2_;
        auVar36._22_2_ = auVar36._0_2_;
        auVar36._24_2_ = auVar36._0_2_;
        auVar36._26_2_ = auVar36._0_2_;
        auVar36._28_2_ = auVar36._0_2_;
        auVar36._30_2_ = auVar36._0_2_;
        auVar21 = vpblendw_avx2(auVar21,auVar36,4);
        auVar37._0_2_ = (undefined2)(uVar6 + 0xb);
        auVar37._2_2_ = auVar37._0_2_;
        auVar37._4_2_ = auVar37._0_2_;
        auVar37._6_2_ = auVar37._0_2_;
        auVar37._8_2_ = auVar37._0_2_;
        auVar37._10_2_ = auVar37._0_2_;
        auVar37._12_2_ = auVar37._0_2_;
        auVar37._14_2_ = auVar37._0_2_;
        auVar37._16_2_ = auVar37._0_2_;
        auVar37._18_2_ = auVar37._0_2_;
        auVar37._20_2_ = auVar37._0_2_;
        auVar37._22_2_ = auVar37._0_2_;
        auVar37._24_2_ = auVar37._0_2_;
        auVar37._26_2_ = auVar37._0_2_;
        auVar37._28_2_ = auVar37._0_2_;
        auVar37._30_2_ = auVar37._0_2_;
        auVar21 = vpblendw_avx2(auVar21,auVar37,8);
        auVar38._0_2_ = (undefined2)(uVar6 + 0xc);
        auVar38._2_2_ = auVar38._0_2_;
        auVar38._4_2_ = auVar38._0_2_;
        auVar38._6_2_ = auVar38._0_2_;
        auVar38._8_2_ = auVar38._0_2_;
        auVar38._10_2_ = auVar38._0_2_;
        auVar38._12_2_ = auVar38._0_2_;
        auVar38._14_2_ = auVar38._0_2_;
        auVar38._16_2_ = auVar38._0_2_;
        auVar38._18_2_ = auVar38._0_2_;
        auVar38._20_2_ = auVar38._0_2_;
        auVar38._22_2_ = auVar38._0_2_;
        auVar38._24_2_ = auVar38._0_2_;
        auVar38._26_2_ = auVar38._0_2_;
        auVar38._28_2_ = auVar38._0_2_;
        auVar38._30_2_ = auVar38._0_2_;
        auVar21 = vpblendw_avx2(auVar21,auVar38,0x10);
        auVar39._0_2_ = (undefined2)(uVar6 + 0xd);
        auVar39._2_2_ = auVar39._0_2_;
        auVar39._4_2_ = auVar39._0_2_;
        auVar39._6_2_ = auVar39._0_2_;
        auVar39._8_2_ = auVar39._0_2_;
        auVar39._10_2_ = auVar39._0_2_;
        auVar39._12_2_ = auVar39._0_2_;
        auVar39._14_2_ = auVar39._0_2_;
        auVar39._16_2_ = auVar39._0_2_;
        auVar39._18_2_ = auVar39._0_2_;
        auVar39._20_2_ = auVar39._0_2_;
        auVar39._22_2_ = auVar39._0_2_;
        auVar39._24_2_ = auVar39._0_2_;
        auVar39._26_2_ = auVar39._0_2_;
        auVar39._28_2_ = auVar39._0_2_;
        auVar39._30_2_ = auVar39._0_2_;
        auVar21 = vpblendw_avx2(auVar21,auVar39,0x20);
        auVar40._0_2_ = (undefined2)(uVar6 + 0xe);
        auVar40._2_2_ = auVar40._0_2_;
        auVar40._4_2_ = auVar40._0_2_;
        auVar40._6_2_ = auVar40._0_2_;
        auVar40._8_2_ = auVar40._0_2_;
        auVar40._10_2_ = auVar40._0_2_;
        auVar40._12_2_ = auVar40._0_2_;
        auVar40._14_2_ = auVar40._0_2_;
        auVar40._16_2_ = auVar40._0_2_;
        auVar40._18_2_ = auVar40._0_2_;
        auVar40._20_2_ = auVar40._0_2_;
        auVar40._22_2_ = auVar40._0_2_;
        auVar40._24_2_ = auVar40._0_2_;
        auVar40._26_2_ = auVar40._0_2_;
        auVar40._28_2_ = auVar40._0_2_;
        auVar40._30_2_ = auVar40._0_2_;
        auVar21 = vpblendw_avx2(auVar21,auVar40,0x40);
        auVar41._0_2_ = (undefined2)(uVar6 + 0xf);
        auVar41._2_2_ = auVar41._0_2_;
        auVar41._4_2_ = auVar41._0_2_;
        auVar41._6_2_ = auVar41._0_2_;
        auVar41._8_2_ = auVar41._0_2_;
        auVar41._10_2_ = auVar41._0_2_;
        auVar41._12_2_ = auVar41._0_2_;
        auVar41._14_2_ = auVar41._0_2_;
        auVar41._16_2_ = auVar41._0_2_;
        auVar41._18_2_ = auVar41._0_2_;
        auVar41._20_2_ = auVar41._0_2_;
        auVar41._22_2_ = auVar41._0_2_;
        auVar41._24_2_ = auVar41._0_2_;
        auVar41._26_2_ = auVar41._0_2_;
        auVar41._28_2_ = auVar41._0_2_;
        auVar41._30_2_ = auVar41._0_2_;
        auVar21 = vpblendw_avx2(auVar21,auVar41,0x80);
        auVar21 = vpblendd_avx2(ZEXT1632(auVar34),auVar21,0xf0);
        auVar21 = vpcmpgtw_avx2(auVar16,auVar21);
        auVar21 = vpblendvb_avx2(auVar14,auVar19,auVar21);
      }
      *(undefined1 (*) [32])((long)dst + 0x60) = auVar21;
      uVar8 = uVar8 + upsample_above;
    }
    else {
      while (iVar5 != 0) {
        *(undefined1 (*) [32])dst = auVar14;
        *(undefined1 (*) [32])((long)dst + 0x20) = auVar14;
        *(undefined1 (*) [32])((long)dst + 0x40) = auVar14;
        *(undefined1 (*) [32])((long)dst + 0x60) = auVar14;
        dst = (uint16_t *)(*(undefined1 (*) [32])dst + stride * 2);
        iVar5 = iVar5 + -1;
      }
    }
    if ((int)lVar1 <= (int)uVar11) break;
    iVar9 = iVar9 + 1;
    dst = (uint16_t *)(*(undefined1 (*) [32])dst + stride * 2);
    N = N + -1;
  }
  return;
}

Assistant:

static void highbd_dr_prediction_32bit_z1_64xN_avx2(int N, uint16_t *dst,
                                                    ptrdiff_t stride,
                                                    const uint16_t *above,
                                                    int upsample_above,
                                                    int dx) {
  // here upsample_above is 0 by design of av1_use_intra_edge_upsample
  (void)upsample_above;
  const int frac_bits = 6;
  const int max_base_x = ((64 + N) - 1);

  // pre-filter above pixels
  // store in temp buffers:
  //   above[x] * 32 + 16
  //   above[x+1] - above[x]
  // final pixels will be calculated as:
  //   (above[x] * 32 + 16 + (above[x+1] - above[x]) * shift) >> 5
  __m256i a0, a0_1, a1, a1_1, a32, a16;
  __m256i a_mbase_x, diff, max_base_x256, base_inc256, mask256;

  a16 = _mm256_set1_epi32(16);
  a_mbase_x = _mm256_set1_epi16(above[max_base_x]);
  max_base_x256 = _mm256_set1_epi16(max_base_x);

  int x = dx;
  for (int r = 0; r < N; r++, dst += stride) {
    __m256i b, res[2], res1;

    int base = x >> frac_bits;
    if (base >= max_base_x) {
      for (int i = r; i < N; ++i) {
        _mm256_storeu_si256((__m256i *)dst, a_mbase_x);  // save 32 values
        _mm256_storeu_si256((__m256i *)(dst + 16), a_mbase_x);
        _mm256_storeu_si256((__m256i *)(dst + 32), a_mbase_x);
        _mm256_storeu_si256((__m256i *)(dst + 48), a_mbase_x);
        dst += stride;
      }
      return;
    }

    __m256i shift = _mm256_srli_epi32(
        _mm256_and_si256(_mm256_set1_epi32(x), _mm256_set1_epi32(0x3f)), 1);

    __m128i a0_128, a0_1_128, a1_128, a1_1_128;
    for (int j = 0; j < 64; j += 16) {
      int mdif = max_base_x - (base + j);
      if (mdif <= 0) {
        _mm256_storeu_si256((__m256i *)(dst + j), a_mbase_x);
      } else {
        a0_128 = _mm_loadu_si128((__m128i *)(above + base + j));
        a1_128 = _mm_loadu_si128((__m128i *)(above + base + 1 + j));
        a0 = _mm256_cvtepu16_epi32(a0_128);
        a1 = _mm256_cvtepu16_epi32(a1_128);

        diff = _mm256_sub_epi32(a1, a0);   // a[x+1] - a[x]
        a32 = _mm256_slli_epi32(a0, 5);    // a[x] * 32
        a32 = _mm256_add_epi32(a32, a16);  // a[x] * 32 + 16
        b = _mm256_mullo_epi32(diff, shift);

        res[0] = _mm256_add_epi32(a32, b);
        res[0] = _mm256_srli_epi32(res[0], 5);
        res[0] = _mm256_packus_epi32(
            res[0],
            _mm256_castsi128_si256(_mm256_extracti128_si256(res[0], 1)));
        if (mdif > 8) {
          a0_1_128 = _mm_loadu_si128((__m128i *)(above + base + 8 + j));
          a1_1_128 = _mm_loadu_si128((__m128i *)(above + base + 9 + j));
          a0_1 = _mm256_cvtepu16_epi32(a0_1_128);
          a1_1 = _mm256_cvtepu16_epi32(a1_1_128);

          diff = _mm256_sub_epi32(a1_1, a0_1);  // a[x+1] - a[x]
          a32 = _mm256_slli_epi32(a0_1, 5);     // a[x] * 32
          a32 = _mm256_add_epi32(a32, a16);     // a[x] * 32 + 16
          b = _mm256_mullo_epi32(diff, shift);

          res[1] = _mm256_add_epi32(a32, b);
          res[1] = _mm256_srli_epi32(res[1], 5);
          res[1] = _mm256_packus_epi32(
              res[1],
              _mm256_castsi128_si256(_mm256_extracti128_si256(res[1], 1)));
        } else {
          res[1] = a_mbase_x;
        }
        res1 = _mm256_inserti128_si256(res[0], _mm256_castsi256_si128(res[1]),
                                       1);  // 16 16bit values
        base_inc256 = _mm256_setr_epi16(
            base + j, base + j + 1, base + j + 2, base + j + 3, base + j + 4,
            base + j + 5, base + j + 6, base + j + 7, base + j + 8,
            base + j + 9, base + j + 10, base + j + 11, base + j + 12,
            base + j + 13, base + j + 14, base + j + 15);

        mask256 = _mm256_cmpgt_epi16(max_base_x256, base_inc256);
        res1 = _mm256_blendv_epi8(a_mbase_x, res1, mask256);
        _mm256_storeu_si256((__m256i *)(dst + j), res1);
      }
    }
    x += dx;
  }
}